

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O3

unique_ptr<void_*[],_std::default_delete<void_*[]>_> __thiscall
tcmalloc::ProduceStackTracesDump
          (tcmalloc *this,_func_StackTrace_ptr_void_ptr_ptr *next_fn,void *head)

{
  uintptr_t uVar1;
  int iVar2;
  StackTrace *pSVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  uintptr_t uVar7;
  int iVar8;
  pointer *__ptr;
  size_t size;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  void *local_38;
  void *entry;
  
  local_38 = head;
  if (head == (void *)0x0) {
    pvVar4 = operator_new(8);
    *(void **)this = pvVar4;
    uVar11 = 0;
  }
  else {
    iVar9 = 0;
    iVar2 = 0;
    do {
      iVar5 = iVar2;
      pSVar3 = (*next_fn)(&local_38);
      iVar8 = (int)pSVar3->depth;
      iVar9 = iVar9 + 3;
      iVar2 = iVar5 + iVar8;
    } while (local_38 != (void *)0x0);
    iVar8 = iVar5 + iVar9 + iVar8;
    size = 0xffffffffffffffff;
    if (-2 < iVar8) {
      size = (long)iVar8 * 8 + 8;
    }
    pvVar4 = operator_new(size);
    uVar11 = 0;
    *(void **)this = pvVar4;
    if (head != (void *)0x0) {
      local_38 = head;
      do {
        pSVar3 = (*next_fn)(&local_38);
        lVar6 = (long)(int)uVar11;
        *(undefined8 *)((long)pvVar4 + lVar6 * 8) = 1;
        *(uintptr_t *)((long)pvVar4 + lVar6 * 8 + 8) = pSVar3->size;
        uVar1 = pSVar3->depth;
        uVar10 = (int)uVar11 + 3;
        *(uintptr_t *)((long)pvVar4 + lVar6 * 8 + 0x10) = uVar1;
        if (uVar1 != 0) {
          uVar7 = 0;
          do {
            *(void **)((long)pvVar4 + uVar7 * 8 + (long)(int)uVar10 * 8) = pSVar3->stack[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
          uVar10 = uVar10 + (int)uVar7;
        }
        uVar11 = (ulong)uVar10;
      } while (local_38 != (void *)0x0);
      uVar11 = (ulong)(int)uVar10;
    }
  }
  *(undefined8 *)((long)pvVar4 + uVar11 * 8) = 0;
  return (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
         (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<void*[]> ProduceStackTracesDump(const StackTrace* (*next_fn)(const void** current_head),
                                                const void* head) {
  int depth_total = 0;
  int bucket_total = 0;
  for (const void* entry = head; entry != nullptr;) {
    const StackTrace* trace = next_fn(&entry);
    depth_total += trace->depth;
    bucket_total++;
  }

  int out_len = bucket_total * 3 + depth_total + 1;
  std::unique_ptr<void*[]> out{new void*[out_len]};

  int idx = 0;
  for (const void* entry = head; entry != nullptr;) {
    const StackTrace* trace = next_fn(&entry);
    out[idx++] = reinterpret_cast<void*>(uintptr_t{1});   // count
    out[idx++] = reinterpret_cast<void*>(trace->size);  // cumulative size
    out[idx++] = reinterpret_cast<void*>(trace->depth);
    for (int d = 0; d < trace->depth; ++d) {
      out[idx++] = trace->stack[d];
    }
  }
  out[idx++] = nullptr;
  ASSERT(idx == out_len);

  return out;
}